

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

int proxy_h2_on_header(nghttp2_session *session,nghttp2_frame *frame,uint8_t *name,size_t namelen,
                      uint8_t *value,size_t valuelen,uint8_t flags,void *userp)

{
  int iVar1;
  Curl_easy *local_78;
  http_resp *local_70;
  http_resp *resp;
  CURLcode local_60;
  int http_status;
  CURLcode result;
  int32_t stream_id;
  Curl_easy *data;
  cf_h2_proxy_ctx *ctx;
  Curl_cfilter *cf;
  size_t valuelen_local;
  uint8_t *value_local;
  size_t namelen_local;
  uint8_t *name_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  ctx = (cf_h2_proxy_ctx *)userp;
  data = *(Curl_easy **)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    local_78 = (Curl_easy *)0x0;
  }
  else {
    local_78 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 8);
  }
  _result = local_78;
  http_status = (frame->hd).stream_id;
  cf = (Curl_cfilter *)valuelen;
  valuelen_local = (size_t)value;
  value_local = (uint8_t *)namelen;
  namelen_local = (size_t)name;
  name_local = (uint8_t *)frame;
  frame_local = (nghttp2_frame *)session;
  if (http_status == (uint)(data->req).offset) {
    if ((frame->hd).type == '\x05') {
      session_local._4_4_ = -0x386;
    }
    else if (((data->req).start100.tv_sec & 0x100000000) == 0) {
      if ((namelen == 7) && (iVar1 = memcmp(":status",name,7), iVar1 == 0)) {
        local_60 = Curl_http_decode_status
                             ((int *)((long)&resp + 4),(char *)valuelen_local,(size_t)cf);
        if (local_60 != CURLE_OK) {
          return -0x386;
        }
        local_60 = Curl_http_resp_make(&local_70,resp._4_4_,(char *)0x0);
        if (local_60 != CURLE_OK) {
          return -0x386;
        }
        local_70->prev = *(http_resp **)(data->last_poll).sockets;
        *(http_resp **)(data->last_poll).sockets = local_70;
        if ((((_result != (Curl_easy *)0x0) &&
             ((*(ulong *)&(_result->set).field_0x8ba >> 0x1c & 1) != 0)) &&
            (ctx != (cf_h2_proxy_ctx *)0x0)) && (0 < *(int *)((long)&(ctx->h2->streams).mem + 4))) {
          Curl_trc_cf_infof(_result,(Curl_cfilter *)ctx,"[%d] status: HTTP/2 %03d",
                            (ulong)(uint)http_status,(ulong)**(uint **)(data->last_poll).sockets);
        }
        return 0;
      }
      if (*(long *)(data->last_poll).sockets == 0) {
        session_local._4_4_ = -0x386;
      }
      else {
        local_60 = Curl_dynhds_add((dynhds *)(*(long *)(data->last_poll).sockets + 0x10),
                                   (char *)namelen_local,(size_t)value_local,(char *)valuelen_local,
                                   (size_t)cf);
        if (local_60 == CURLE_OK) {
          if (((_result != (Curl_easy *)0x0) &&
              ((*(ulong *)&(_result->set).field_0x8ba >> 0x1c & 1) != 0)) &&
             ((ctx != (cf_h2_proxy_ctx *)0x0 && (0 < *(int *)((long)&(ctx->h2->streams).mem + 4)))))
          {
            Curl_trc_cf_infof(_result,(Curl_cfilter *)ctx,"[%d] header: %.*s: %.*s",
                              (ulong)(uint)http_status,(ulong)value_local & 0xffffffff,namelen_local
                              ,(int)cf,valuelen_local);
          }
          session_local._4_4_ = 0;
        }
        else {
          session_local._4_4_ = -0x386;
        }
      }
    }
    else {
      session_local._4_4_ = 0;
    }
  }
  else {
    if (((local_78 != (Curl_easy *)0x0) &&
        ((*(ulong *)&(local_78->set).field_0x8ba >> 0x1c & 1) != 0)) &&
       ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
      Curl_trc_cf_infof(local_78,(Curl_cfilter *)userp,
                        "[%d] header for non-tunnel stream: %.*s: %.*s",(ulong)(uint)http_status,
                        namelen & 0xffffffff,name,(int)valuelen,value);
    }
    session_local._4_4_ = -0x386;
  }
  return session_local._4_4_;
}

Assistant:

static int proxy_h2_on_header(nghttp2_session *session,
                              const nghttp2_frame *frame,
                              const uint8_t *name, size_t namelen,
                              const uint8_t *value, size_t valuelen,
                              uint8_t flags,
                              void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;

  (void)flags;
  (void)data;
  (void)session;
  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */
  if(stream_id != ctx->tunnel.stream_id) {
    CURL_TRC_CF(data, cf, "[%d] header for non-tunnel stream: "
                "%.*s: %.*s", stream_id,
                (int)namelen, name, (int)valuelen, value);
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  if(frame->hd.type == NGHTTP2_PUSH_PROMISE)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  if(ctx->tunnel.has_final_response) {
    /* we do not do anything with trailers for tunnel streams */
    return 0;
  }

  if(namelen == sizeof(HTTP_PSEUDO_STATUS) - 1 &&
     memcmp(HTTP_PSEUDO_STATUS, name, namelen) == 0) {
    int http_status;
    struct http_resp *resp;

    /* status: always comes first, we might get more than one response,
     * link the previous ones for keepers */
    result = Curl_http_decode_status(&http_status,
                                    (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = Curl_http_resp_make(&resp, http_status, NULL);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    resp->prev = ctx->tunnel.resp;
    ctx->tunnel.resp = resp;
    CURL_TRC_CF(data, cf, "[%d] status: HTTP/2 %03d",
                stream_id, ctx->tunnel.resp->status);
    return 0;
  }

  if(!ctx->tunnel.resp)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  result = Curl_dynhds_add(&ctx->tunnel.resp->headers,
                           (const char *)name, namelen,
                           (const char *)value, valuelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  CURL_TRC_CF(data, cf, "[%d] header: %.*s: %.*s",
              stream_id, (int)namelen, name, (int)valuelen, value);

  return 0; /* 0 is successful */
}